

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExportRef
BinaryenAddTableExport(BinaryenModuleRef module,char *internalName,char *externalName)

{
  Export *curr;
  IString *pIVar1;
  undefined1 in_CL;
  string_view s;
  string_view sVar2;
  
  curr = (Export *)operator_new(0x28);
  (curr->name).super_IString.str._M_len = 0;
  (curr->name).super_IString.str._M_str = (char *)0x0;
  (curr->value).super_IString.str._M_len = 0;
  (curr->value).super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&curr->kind = 0;
  pIVar1 = (IString *)strlen(internalName);
  sVar2._M_str = (char *)0x0;
  sVar2._M_len = (size_t)internalName;
  sVar2 = wasm::IString::interned(pIVar1,sVar2,(bool)in_CL);
  (curr->value).super_IString.str = sVar2;
  pIVar1 = (IString *)strlen(externalName);
  s._M_str = (char *)0x0;
  s._M_len = (size_t)externalName;
  sVar2 = wasm::IString::interned(pIVar1,s,(bool)in_CL);
  (curr->name).super_IString.str = sVar2;
  curr->kind = Table;
  wasm::Module::addExport(module,curr);
  return curr;
}

Assistant:

BinaryenExportRef BinaryenAddTableExport(BinaryenModuleRef module,
                                         const char* internalName,
                                         const char* externalName) {
  auto* ret = new Export();
  ret->value = internalName;
  ret->name = externalName;
  ret->kind = ExternalKind::Table;
  ((Module*)module)->addExport(ret);
  return ret;
}